

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  CMUnitTest tests [19];
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar6 = (ulong)puVar2[2];
  uVar4 = *puVar2 >> 4;
  uVar1 = uVar4 - 0x2065;
  if (10 < uVar1) {
LAB_00102602:
    switch(uVar4) {
    case 0x1066:
switchD_001027bd_caseD_1066:
      pcVar7 = "Merom";
      goto LAB_001028dd;
    case 0x1067:
    case 0x106d:
      pcVar7 = "Penryn";
      goto LAB_001028dd;
    case 0x1068:
    case 0x1069:
    case 0x106b:
    case 0x106c:
switchD_001027bd_caseD_1068:
      pcVar7 = "unknown";
      goto LAB_001028dd;
    case 0x106a:
    case 0x106e:
      goto switchD_001027bd_caseD_106a;
    default:
      if (uVar4 - 99 < 2) {
        pcVar7 = "Prescott";
        goto LAB_001028dd;
      }
      if (uVar4 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_001028dd;
      }
      if (uVar4 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x66) {
        pcVar7 = "Presler";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x6d) {
        pcVar7 = "Dothan";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x6f) goto switchD_001027bd_caseD_1066;
      if (uVar4 == 0x16c) {
        pcVar7 = "Pineview";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x266) {
        pcVar7 = "Lincroft";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x366) {
        pcVar7 = "Cedarview";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x30f1) goto LAB_001027cb;
      if (uVar4 == 0x60f10) {
        pcVar7 = "Zen4";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x506c) {
LAB_0010282b:
        pcVar7 = "Goldmont";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x506e) {
        pcVar7 = "Skylake";
        goto LAB_001028dd;
      }
      if (uVar4 == 0x606a) {
LAB_00102837:
        pcVar7 = "Icelake";
      }
      else {
        if ((uVar4 != 0x60f0) && (uVar4 != 0x60f8)) {
          if (uVar4 == 0x706a) goto LAB_0010282b;
          if (uVar4 == 0x706e) goto LAB_00102837;
          if (uVar4 != 0x70f1) {
            if (uVar4 != 0x806e) {
              if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
                pcVar7 = "Alderlake";
                goto LAB_001028dd;
              }
              if (uVar4 != 0x906e) {
                if (uVar4 != 0x90f0) {
                  if (uVar4 == 0xa067) {
                    pcVar7 = "Rocketlake";
                    goto LAB_001028dd;
                  }
                  if (uVar4 == 0xb067) {
                    pcVar7 = "Raptorlake";
                    goto LAB_001028dd;
                  }
                  if (uVar4 != 0x20f10) {
                    if (uVar4 == 0x40f40) {
                      pcVar7 = "Zen3+";
                      goto LAB_001028dd;
                    }
                    if (uVar4 != 0x50f00) {
                      if (uVar4 == 0x406c) {
                        pcVar7 = "CherryTrail";
                        goto LAB_001028dd;
                      }
                      goto switchD_001027bd_caseD_1068;
                    }
                  }
                  pcVar7 = "Zen3";
                  goto LAB_001028dd;
                }
                goto LAB_001027cb;
              }
            }
            pcVar7 = "Kabylake";
            goto LAB_001028dd;
          }
        }
LAB_001027cb:
        pcVar7 = "Zen2";
      }
      goto LAB_001028dd;
    }
  }
  uVar6 = 0x481;
  if ((0x481U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "Westmere";
    goto LAB_001028dd;
  }
  uVar6 = 0x120;
  if ((0x120U >> (uVar1 & 0x1f) & 1) != 0) {
    pcVar7 = "SandyBridge";
    goto LAB_001028dd;
  }
  if (uVar1 != 9) goto LAB_00102602;
switchD_001027bd_caseD_106a:
  pcVar7 = "Nehalem";
LAB_001028dd:
  printf("x64 processor:  %s\t",pcVar7,uVar6);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar3 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar3 + 0xc) != '@') {
    lVar3 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar3 + 0xc),
           (ulong)*(uint *)(lVar3 + 8));
  }
  memcpy(tests,&PTR_anon_var_dwarf_fb_00130ae0,0x2f8);
  iVar5 = _cmocka_run_group_tests("tests",tests,0x13,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar5;
}

Assistant:

int main() {
    tellmeall();
#if CROARING_IS_BIG_ENDIAN
    printf("Big-endian IO unsupported.\n");
    return EXIT_SUCCESS;
#else
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_robust_deserialize1),
        cmocka_unit_test(test_robust_deserialize2),
        cmocka_unit_test(test_robust_deserialize3),
        cmocka_unit_test(test_robust_deserialize4),
        cmocka_unit_test(test_robust_deserialize5),
        cmocka_unit_test(test_robust_deserialize6),
        cmocka_unit_test(test_robust_deserialize7),
        cmocka_unit_test(deserialize_negative_container_count),
        cmocka_unit_test(deserialize_huge_container_count),
        cmocka_unit_test(deserialize_duplicate_keys),
        cmocka_unit_test(deserialize_unsorted_keys),
        cmocka_unit_test(deserialize_duplicate_array),
        cmocka_unit_test(deserialize_unsorted_array),
        cmocka_unit_test(deserialize_bitset_incorrect_cardinality),
        cmocka_unit_test(deserialize_run_container_empty),
        cmocka_unit_test(deserialize_run_container_should_combine),
        cmocka_unit_test(deserialize_run_container_overlap),
        cmocka_unit_test(deserialize_run_container_overflow),
        cmocka_unit_test(
            deserialize_run_container_incorrect_cardinality_still_allowed),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
#endif
}